

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmMakefileTargetGenerator::GetLinkRule
          (string *__return_storage_ptr__,cmMakefileTargetGenerator *this,string *linkRuleVar)

{
  bool bVar1;
  char *pcVar2;
  char *rule;
  allocator local_59;
  undefined1 local_58 [8];
  string ruleVar;
  allocator local_22;
  undefined1 local_21;
  string *local_20;
  string *linkRuleVar_local;
  cmMakefileTargetGenerator *this_local;
  string *linkRule;
  
  local_21 = 0;
  local_20 = linkRuleVar;
  linkRuleVar_local = (string *)this;
  this_local = (cmMakefileTargetGenerator *)__return_storage_ptr__;
  pcVar2 = cmMakefile::GetRequiredDefinition
                     ((this->super_cmCommonTargetGenerator).Makefile,linkRuleVar);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  bVar1 = cmGeneratorTarget::HasImplibGNUtoMS((this->super_cmCommonTargetGenerator).GeneratorTarget)
  ;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_58,"CMAKE_",&local_59);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    cmGeneratorTarget::GetLinkerLanguage
              ((string *)&rule,(this->super_cmCommonTargetGenerator).GeneratorTarget,
               &(this->super_cmCommonTargetGenerator).ConfigName);
    std::__cxx11::string::operator+=((string *)local_58,(string *)&rule);
    std::__cxx11::string::~string((string *)&rule);
    std::__cxx11::string::operator+=((string *)local_58,"_GNUtoMS_RULE");
    pcVar2 = cmMakefile::GetDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_58);
    if (pcVar2 != (char *)0x0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar2);
    }
    std::__cxx11::string::~string((string *)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmMakefileTargetGenerator::GetLinkRule(
                                              const std::string& linkRuleVar)
{
  std::string linkRule = this->Makefile->GetRequiredDefinition(linkRuleVar);
  if(this->GeneratorTarget->HasImplibGNUtoMS())
    {
    std::string ruleVar = "CMAKE_";
    ruleVar += this->GeneratorTarget->GetLinkerLanguage(this->ConfigName);
    ruleVar += "_GNUtoMS_RULE";
    if(const char* rule = this->Makefile->GetDefinition(ruleVar))
      {
      linkRule += rule;
      }
    }
  return linkRule;
}